

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_new_game.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
PatchNewGame::build_flag_array
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          PatchNewGame *this,World *world)

{
  byte bVar1;
  bool bVar2;
  uint8_t uVar3;
  vector<Flag,_std::allocator<Flag>_> *this_00;
  reference pFVar4;
  Item *pIVar5;
  byte *pbVar6;
  byte local_5a;
  byte local_59;
  uint8_t msh_quantity;
  uint8_t lsh_quantity;
  uint8_t inventory_flag_value;
  uint8_t item_id;
  Flag *flag;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Flag,_std::allocator<Flag>_> *__range1;
  value_type_conflict local_22 [2];
  World *local_20;
  World *world_local;
  PatchNewGame *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *flag_array;
  
  local_22[1] = 0;
  local_20 = world;
  world_local = (World *)this;
  this_local = (PatchNewGame *)__return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  local_22[0] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (__return_storage_ptr__,0x80,local_22);
  this_00 = World::starting_flags(local_20);
  __end1 = std::vector<Flag,_std::allocator<Flag>_>::begin(this_00);
  flag = (Flag *)std::vector<Flag,_std::allocator<Flag>_>::end(this_00);
  while (bVar2 = __gnu_cxx::operator==<const_Flag_*,_std::vector<Flag,_std::allocator<Flag>_>_>
                           (&__end1,(__normal_iterator<const_Flag_*,_std::vector<Flag,_std::allocator<Flag>_>_>
                                     *)&flag), ((bVar2 ^ 0xffU) & 1) != 0) {
    pFVar4 = __gnu_cxx::__normal_iterator<const_Flag_*,_std::vector<Flag,_std::allocator<Flag>_>_>::
             operator*(&__end1);
    bVar1 = pFVar4->bit;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,(ulong)(byte)pFVar4->byte);
    *pbVar6 = *pbVar6 | (byte)(1 << (bVar1 & 0x1f));
    __gnu_cxx::__normal_iterator<const_Flag_*,_std::vector<Flag,_std::allocator<Flag>_>_>::
    operator++(&__end1);
  }
  for (local_59 = 0; local_59 < 0x3e; local_59 = local_59 + 2) {
    local_5a = 0;
    pIVar5 = World::item(local_20,local_59);
    uVar3 = Item::starting_quantity(pIVar5);
    if (uVar3 != '\0') {
      local_5a = uVar3 + 1 & 0xf;
    }
    pIVar5 = World::item(local_20,local_59 + 1);
    uVar3 = Item::starting_quantity(pIVar5);
    if (uVar3 != '\0') {
      local_5a = local_5a | (uVar3 + '\x01') * '\x10';
    }
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,(long)(int)(local_59 / 2 + 0x40));
    *pbVar6 = local_5a;
  }
  if ((this->_add_ingame_tracker & 1U) != 0) {
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,0x4b);
    *pbVar6 = *pbVar6 | 0x10;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,0x4c);
    *pbVar6 = *pbVar6 | 0x10;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,0x4d);
    *pbVar6 = *pbVar6 | 0x11;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,0x4f);
    *pbVar6 = *pbVar6 | 0x11;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,0x50);
    *pbVar6 = *pbVar6 | 1;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,0x55);
    *pbVar6 = *pbVar6 | 0x10;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,0x57);
    *pbVar6 = *pbVar6 | 0x10;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,0x58);
    *pbVar6 = *pbVar6 | 0x10;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,0x59);
    *pbVar6 = *pbVar6 | 0x11;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,0x5b);
    *pbVar6 = *pbVar6 | 0x10;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,0x5c);
    *pbVar6 = *pbVar6 | 0x11;
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::vector<uint8_t> build_flag_array(const World& world) const
    {
        std::vector<uint8_t> flag_array;
        flag_array.resize(0x80, 0x00);

        // Apply starting flags
        for(const Flag& flag : world.starting_flags())
            flag_array[(uint8_t)flag.byte] |= (1 << flag.bit);

        // Apply starting inventory
        for(uint8_t item_id=0 ; item_id < ITEM_LIFESTOCK ; item_id += 0x2)
        {
            uint8_t inventory_flag_value = 0x00;

            uint8_t lsh_quantity = world.item(item_id)->starting_quantity();
            if(lsh_quantity)
                inventory_flag_value |= (lsh_quantity+1) & 0x0F;

            uint8_t msh_quantity = world.item(item_id+1)->starting_quantity();
            if(msh_quantity)
                inventory_flag_value |= ((msh_quantity+1) & 0x0F) << 4;

            flag_array[0x40 + (item_id / 2)] = inventory_flag_value;
        }

        if(_add_ingame_tracker)
        {
            // The ingame-tracker consists in putting in "grayed-out" key items in the inventory,
            // as if they were already obtained but lost (like lithograph in OG)
            flag_array[0x4B] |= 0x10;
            flag_array[0x4C] |= 0x10;
            flag_array[0x4D] |= 0x11;
            flag_array[0x4F] |= 0x11;
            flag_array[0x50] |= 0x01;
            flag_array[0x55] |= 0x10;
            flag_array[0x57] |= 0x10;
            flag_array[0x58] |= 0x10;
            flag_array[0x59] |= 0x11;
            flag_array[0x5B] |= 0x10;
            flag_array[0x5C] |= 0x11;
        }

        return flag_array;
    }